

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pid.c
# Opt level: O2

inform_pid_lattice *
inform_pid(int *stimulus,int *responses,size_t l,size_t n,int bs,int *br,inform_error *err)

{
  double dVar1;
  inform_pid_source *piVar2;
  inform_pid_source *b;
  uint32_t *puVar3;
  inform_error iVar4;
  bool bVar5;
  bool bVar6;
  bool bVar7;
  _Bool _Var8;
  size_t i;
  size_t sVar9;
  EVP_PKEY_CTX *ctx;
  size_t *psVar10;
  size_t *psVar11;
  inform_dist *piVar12;
  gvector pvVar13;
  int *piVar14;
  uint *v;
  inform_pid_source **ppiVar15;
  inform_pid_source *piVar16;
  inform_pid_source **srcs;
  inform_pid_lattice *piVar17;
  size_t sVar18;
  size_t j_1;
  ulong uVar19;
  int *piVar20;
  ulong uVar21;
  inform_pid_source *piVar22;
  inform_pid_source *piVar23;
  int iVar24;
  size_t sVar25;
  size_t sVar26;
  ulong uVar27;
  size_t s_1;
  size_t s;
  ulong uVar28;
  long lVar29;
  uint *puVar30;
  uint *puVar31;
  size_t k_3;
  double dVar32;
  double dVar33;
  undefined1 auVar34 [16];
  double dVar35;
  inform_pid_source **local_e8;
  inform_pid_source *local_d8;
  inform_error local_c8;
  inform_pid_source *local_a8;
  gvector local_90;
  inform_pid_source **local_88;
  
  if (stimulus == (int *)0x0 || responses == (int *)0x0) {
    if (err == (inform_error *)0x0) {
      return (inform_pid_lattice *)0x0;
    }
    iVar4 = INFORM_ETIMESERIES;
  }
  else if (l == 0) {
    if (err == (inform_error *)0x0) {
      return (inform_pid_lattice *)0x0;
    }
    iVar4 = INFORM_ENOSOURCES;
  }
  else if (n == 0) {
    if (err == (inform_error *)0x0) {
      return (inform_pid_lattice *)0x0;
    }
    iVar4 = INFORM_ESHORTSERIES;
  }
  else {
    if ((1 < bs) && (br != (int *)0x0)) {
      sVar9 = 0;
      do {
        if (l == sVar9) {
          sVar9 = 0;
          goto LAB_001352aa;
        }
        piVar14 = br + sVar9;
        sVar9 = sVar9 + 1;
      } while (1 < *piVar14);
    }
    if (err == (inform_error *)0x0) {
      return (inform_pid_lattice *)0x0;
    }
    iVar4 = INFORM_EBASE;
  }
LAB_0013528d:
  *err = iVar4;
  return (inform_pid_lattice *)0x0;
LAB_00135304:
  if (err == (inform_error *)0x0) {
    return (inform_pid_lattice *)0x0;
  }
  iVar4 = INFORM_ENEGSTATE;
  goto LAB_0013528d;
LAB_001352bf:
  if (err == (inform_error *)0x0) {
    return (inform_pid_lattice *)0x0;
  }
  iVar4 = INFORM_EBADSTATE;
  goto LAB_0013528d;
LAB_001353b8:
  sVar9 = sVar9 + 1;
  psVar10 = psVar11;
  goto LAB_0013538b;
LAB_001352aa:
  if (n != sVar9) {
    piVar14 = stimulus + sVar9;
    if (*piVar14 < 0) goto LAB_00135304;
    sVar9 = sVar9 + 1;
    if (bs <= *piVar14) goto LAB_001352bf;
    goto LAB_001352aa;
  }
  piVar14 = responses;
  for (sVar9 = 0; sVar9 != l; sVar9 = sVar9 + 1) {
    sVar18 = 0;
    while (n != sVar18) {
      piVar20 = piVar14 + sVar18;
      if (*piVar20 < 0) goto LAB_00135304;
      sVar18 = sVar18 + 1;
      if (br[sVar9] <= *piVar20) goto LAB_001352bf;
    }
    piVar14 = piVar14 + n;
  }
  uVar28 = (ulong)(1 << ((byte)l & 0x1f));
  sVar9 = uVar28 - 1;
  ctx = (EVP_PKEY_CTX *)gvector_alloc(sVar9,sVar9,8);
  memset(ctx,0,*(long *)(ctx + -8) << 3);
  for (uVar19 = 1; uVar19 < uVar28; uVar19 = uVar19 + 1) {
    psVar10 = (size_t *)gvector_alloc(l,0,8);
    if (psVar10 == (size_t *)0x0) {
      for (uVar19 = 0; uVar19 < *(ulong *)(ctx + -8); uVar19 = uVar19 + 1) {
        gvector_free(*(gvector *)(ctx + uVar19 * 8));
      }
LAB_001359de:
      gvector_free(ctx);
LAB_00135428:
      if (err != (inform_error *)0x0) {
        *err = INFORM_ENOMEM;
        return (inform_pid_lattice *)0x0;
      }
      ctx = (EVP_PKEY_CTX *)0x0;
      bVar7 = true;
      goto LAB_00135443;
    }
    sVar9 = 0;
LAB_0013538b:
    if (l != sVar9) {
      psVar11 = psVar10;
      if (((uVar19 & (long)(1 << ((byte)sVar9 & 0x1f))) == 0) ||
         (psVar11 = push_value(psVar10,sVar9), psVar11 != (size_t *)0x0)) goto LAB_001353b8;
      gvector_free(psVar10);
      for (uVar19 = 0; uVar19 < *(ulong *)(ctx + -8); uVar19 = uVar19 + 1) {
        gvector_free(*(gvector *)(ctx + uVar19 * 8));
      }
      gvector_free(ctx);
      goto LAB_00135428;
    }
    pvVar13 = gvector_shrink(psVar10);
    if (pvVar13 == (gvector)0x0) {
      gvector_free(psVar10);
      for (uVar19 = 0; uVar19 < *(ulong *)(ctx + -8); uVar19 = uVar19 + 1) {
        gvector_free(*(gvector *)(ctx + uVar19 * 8));
      }
      goto LAB_001359de;
    }
    *(gvector *)(ctx + uVar19 * 8 + -8) = pvVar13;
  }
  if (err == (inform_error *)0x0) {
    bVar7 = true;
  }
  else {
    if (*err != INFORM_SUCCESS) {
      return (inform_pid_lattice *)0x0;
    }
    bVar7 = false;
  }
LAB_00135443:
  sVar9 = *(size_t *)(ctx + -8);
  piVar12 = inform_dist_infer(stimulus,n);
  if ((piVar12 == (inform_dist *)0x0) ||
     (pvVar13 = gvector_alloc(sVar9,sVar9,8), pvVar13 == (gvector)0x0)) {
    cleanup(ctx);
    if (!bVar7) {
      *err = INFORM_ENOMEM;
      return (inform_pid_lattice *)0x0;
    }
    return (inform_pid_lattice *)0x0;
  }
  for (sVar18 = 0; sVar9 != sVar18; sVar18 = sVar18 + 1) {
    *(undefined8 *)((long)pvVar13 + sVar18 * 8) = 0;
  }
  auVar34._8_4_ = (int)(n >> 0x20);
  auVar34._0_8_ = n;
  auVar34._12_4_ = 0x45300000;
  uVar19 = (ulong)(uint)bs;
  for (sVar18 = 0; sVar18 != sVar9; sVar18 = sVar18 + 1) {
    lVar29 = *(long *)(ctx + sVar18 * 8);
    sVar26 = *(size_t *)(lVar29 + -8);
    sVar25 = (sVar26 + 1) * n;
    piVar14 = (int *)gvector_alloc(sVar25,sVar25,4);
    if (piVar14 == (int *)0x0) {
LAB_00135805:
      if (!bVar7) {
        *err = INFORM_ENOMEM;
        *(undefined8 *)((long)pvVar13 + sVar18 * 8) = 0;
        goto LAB_00135b7c;
      }
      *(undefined8 *)((long)pvVar13 + sVar18 * 8) = 0;
    }
    else {
      piVar20 = piVar14;
      for (sVar25 = 0; sVar26 != sVar25; sVar25 = sVar25 + 1) {
        memcpy(piVar20,responses + *(long *)(lVar29 + sVar25 * 8) * n,n * 4);
        piVar20 = piVar20 + n;
      }
      piVar20 = piVar14 + sVar26 * n;
      inform_black_box(piVar14,sVar26,1,n,br,(size_t *)0x0,(size_t *)0x0,piVar20,err);
      _Var8 = inform_failed(err);
      local_90 = (gvector)0x0;
      if (!_Var8) {
        uVar28 = 1;
        for (sVar25 = 0; iVar24 = (int)uVar28, sVar26 != sVar25; sVar25 = sVar25 + 1) {
          uVar28 = (ulong)(uint)(iVar24 * br[*(long *)(lVar29 + sVar25 * 8)]);
        }
        lVar29 = (long)(iVar24 * bs);
        sVar26 = iVar24 + lVar29;
        v = (uint *)gvector_alloc(sVar26,sVar26,4);
        if (v != (uint *)0x0) {
          for (sVar25 = 0; sVar26 != sVar25; sVar25 = sVar25 + 1) {
            v[sVar25] = 0;
          }
          for (sVar26 = 0; n != sVar26; sVar26 = sVar26 + 1) {
            v[lVar29 + piVar20[sVar26]] = v[lVar29 + piVar20[sVar26]] + 1;
            v[(long)bs * (long)piVar20[sVar26] + (long)stimulus[sVar26]] =
                 v[(long)bs * (long)piVar20[sVar26] + (long)stimulus[sVar26]] + 1;
          }
          local_90 = gvector_alloc(uVar19,uVar19,8);
          if (local_90 != (gvector)0x0) {
            if (iVar24 < 1) {
              uVar28 = 0;
            }
            puVar30 = v;
            for (uVar27 = 0; uVar27 != uVar19; uVar27 = uVar27 + 1) {
              *(undefined8 *)((long)local_90 + uVar27 * 8) = 0;
              if (piVar12->histogram[uVar27] != 0) {
                dVar32 = (double)piVar12->histogram[uVar27];
                dVar33 = 0.0;
                puVar31 = puVar30;
                for (uVar21 = 0; uVar28 != uVar21; uVar21 = uVar21 + 1) {
                  if ((v[lVar29 + uVar21] != 0) && (*puVar31 != 0)) {
                    dVar35 = (double)*puVar31;
                    dVar33 = log2((((auVar34._8_8_ - 1.9342813113834067e+25) +
                                   ((double)CONCAT44(0x43300000,(int)n) - 4503599627370496.0)) *
                                  dVar35) / ((double)v[lVar29 + uVar21] * dVar32));
                    dVar33 = dVar33 * dVar35 + *(double *)((long)local_90 + uVar27 * 8);
                    *(double *)((long)local_90 + uVar27 * 8) = dVar33;
                  }
                  puVar31 = puVar31 + uVar19;
                }
                *(double *)((long)local_90 + uVar27 * 8) = dVar33 / dVar32;
              }
              puVar30 = puVar30 + 1;
            }
            gvector_free(v);
            goto LAB_001357ba;
          }
          gvector_free(v);
        }
        gvector_free(piVar14);
        goto LAB_00135805;
      }
LAB_001357ba:
      gvector_free(piVar14);
      *(gvector *)((long)pvVar13 + sVar18 * 8) = local_90;
      if ((!bVar7) && (*err != INFORM_SUCCESS)) goto LAB_00135b7c;
    }
  }
  ppiVar15 = (inform_pid_source **)gvector_alloc(0,0,8);
  local_c8 = INFORM_ENOMEM;
  if (ppiVar15 == (inform_pid_source **)0x0) {
LAB_00135ac7:
    if (!bVar7) {
LAB_00135b69:
      *err = local_c8;
      goto LAB_00135b7c;
    }
    local_e8 = (inform_pid_source **)0x0;
LAB_00135ada:
    toposort(local_e8,err);
    if ((local_e8 == (inform_pid_source **)0x0) ||
       (local_a8 = local_e8[-1], local_a8 == (inform_pid_source *)0x0)) {
      piVar17 = (inform_pid_lattice *)0x0;
      goto LAB_00135d28;
    }
    bVar5 = true;
  }
  else {
    uVar28 = (ulong)(uint)~(-1 << ((byte)l & 0x1f));
    sVar9 = 1;
    do {
      if (sVar9 - uVar28 == 1) {
        local_e8 = (inform_pid_source **)gvector_shrink(ppiVar15);
        if (local_e8 == (inform_pid_source **)0x0) {
          free_all_sources(ppiVar15);
          goto LAB_00135ac7;
        }
        if (!bVar7) goto LAB_00135a52;
        goto LAB_00135ada;
      }
      psVar10 = (size_t *)gvector_alloc(1,1,8);
      if (psVar10 == (size_t *)0x0) goto LAB_00135ac7;
      *psVar10 = sVar9;
      piVar16 = alloc_source(psVar10,err);
      if ((!bVar7) && (*err != INFORM_SUCCESS)) {
        gvector_free(psVar10);
        goto LAB_00135a4a;
      }
      srcs = push_source(ppiVar15,piVar16);
      if (srcs == (inform_pid_source **)0x0) {
        free_source(piVar16);
        free_all_sources(ppiVar15);
        gvector_free(psVar10);
        goto LAB_00135ac7;
      }
      sVar9 = sVar9 + 1;
      ppiVar15 = sources_rec(sVar9,uVar28,psVar10,srcs,err);
    } while ((bVar7) || (*err == INFORM_SUCCESS));
    free_all_sources(ppiVar15);
LAB_00135a4a:
    local_e8 = (inform_pid_source **)0x0;
LAB_00135a52:
    if ((*err != INFORM_SUCCESS) || (toposort(local_e8,err), *err != INFORM_SUCCESS))
    goto LAB_00135b7c;
    local_c8 = INFORM_EARG;
    if ((local_e8 == (inform_pid_source **)0x0) ||
       (local_a8 = local_e8[-1], local_a8 == (inform_pid_source *)0x0)) goto LAB_00135b69;
    bVar5 = false;
  }
  local_88 = local_e8 + -1;
  piVar17 = (inform_pid_lattice *)malloc(0x20);
  if (piVar17 == (inform_pid_lattice *)0x0) {
    bVar6 = true;
    if (!bVar5) {
      *err = INFORM_ENOMEM;
      goto LAB_00135d0d;
    }
LAB_00135ba8:
    local_d8 = (inform_pid_source *)0x0;
    piVar16 = local_d8;
LAB_00135bb1:
    local_d8 = piVar16;
    if (local_d8 != local_a8) {
      piVar16 = (inform_pid_source *)((long)&local_d8->name + 1);
      for (piVar22 = piVar16; piVar22 < local_a8;
          piVar22 = (inform_pid_source *)((long)&piVar22->name + 1)) {
        piVar2 = local_e8[(long)local_d8];
        b = local_e8[(long)piVar22];
        _Var8 = below(piVar2,b);
        if (_Var8) {
          ppiVar15 = piVar2->above;
          piVar2 = ppiVar15[-1];
          piVar23 = (inform_pid_source *)0x0;
          while (piVar2 != piVar23) {
            _Var8 = below(ppiVar15[(long)piVar23],b);
            piVar23 = (inform_pid_source *)((long)&piVar23->name + 1);
            if (_Var8) goto LAB_00135bb1;
          }
          ppiVar15 = push_source(ppiVar15,b);
          if (ppiVar15 != (inform_pid_source **)0x0) {
            local_e8[(long)local_d8]->above = ppiVar15;
            piVar2 = local_e8[(long)local_d8];
            psVar10 = &piVar2->n_above;
            *psVar10 = *psVar10 + 1;
            ppiVar15 = push_source(local_e8[(long)piVar22]->below,piVar2);
            if (ppiVar15 != (inform_pid_source **)0x0) {
              local_e8[(long)piVar22]->below = ppiVar15;
              local_e8[(long)piVar22]->n_below = local_e8[(long)piVar22]->n_below + 1;
              goto LAB_00135c82;
            }
          }
          free_all_sources(local_e8);
          if (!bVar6) {
            *err = INFORM_ENOMEM;
          }
          piVar17 = (inform_pid_lattice *)0x0;
          goto LAB_00135ce5;
        }
LAB_00135c82:
      }
      goto LAB_00135bb1;
    }
    piVar17->sources = local_e8;
    piVar17->bottom = *local_e8;
    piVar17->top = local_e8[(long)((long)&local_a8[-1].pi + 7)];
    piVar17->size = (size_t)*local_88;
LAB_00135ce5:
    if ((!bVar5) && (*err != INFORM_SUCCESS)) {
      piVar17 = (inform_pid_lattice *)0x0;
    }
  }
  else {
    piVar17->bottom = (inform_pid_source *)0x0;
    piVar17->sources = (inform_pid_source **)0x0;
    piVar17->top = (inform_pid_source *)0x0;
    bVar6 = true;
    if ((bVar5) || (bVar6 = false, *err == INFORM_SUCCESS)) goto LAB_00135ba8;
LAB_00135d0d:
    piVar17 = (inform_pid_lattice *)0x0;
  }
  if ((!bVar7) && (*err != INFORM_SUCCESS)) {
LAB_00135b7c:
    cleanup(ctx);
    return (inform_pid_lattice *)0x0;
  }
LAB_00135d28:
  sVar9 = piVar17->size;
  for (sVar18 = 0; sVar18 != sVar9; sVar18 = sVar18 + 1) {
    piVar16 = piVar17->sources[sVar18];
    piVar16->imin = 0.0;
    lVar29 = *(long *)((long)pvVar13 + *piVar16->name * 8 + -8);
    puVar3 = piVar12->histogram;
    dVar32 = 0.0;
    for (uVar28 = 0; uVar28 != uVar19; uVar28 = uVar28 + 1) {
      dVar33 = *(double *)(lVar29 + uVar28 * 8);
      for (uVar27 = 1; uVar27 < piVar16->size; uVar27 = uVar27 + 1) {
        dVar35 = *(double *)(*(long *)((long)pvVar13 + piVar16->name[uVar27] * 8 + -8) + uVar28 * 8)
        ;
        if (dVar35 <= dVar33) {
          dVar33 = dVar35;
        }
      }
      dVar32 = dVar32 + (double)puVar3[uVar28] * dVar33;
      piVar16->imin = dVar32;
    }
    piVar16->imin =
         dVar32 / (((double)CONCAT44(0x45300000,(int)(piVar12->counts >> 0x20)) -
                   1.9342813113834067e+25) +
                  ((double)CONCAT44(0x43300000,(int)piVar12->counts) - 4503599627370496.0));
  }
  for (sVar18 = 0; sVar18 != sVar9; sVar18 = sVar18 + 1) {
    piVar16 = piVar17->sources[sVar18];
    puVar3 = piVar12->histogram;
    dVar32 = piVar16->pi;
    for (uVar28 = 0; uVar28 != uVar19; uVar28 = uVar28 + 1) {
      dVar33 = -INFINITY;
      for (sVar26 = 0; sVar26 != piVar16->n_below; sVar26 = sVar26 + 1) {
        psVar10 = piVar16->below[sVar26]->name;
        dVar35 = *(double *)(*(long *)((long)pvVar13 + *psVar10 * 8 + -8) + uVar28 * 8);
        for (uVar27 = 1; uVar27 < piVar16->below[sVar26]->size; uVar27 = uVar27 + 1) {
          dVar1 = *(double *)(*(long *)((long)pvVar13 + psVar10[uVar27] * 8 + -8) + uVar28 * 8);
          if (dVar1 <= dVar35) {
            dVar35 = dVar1;
          }
        }
        if (dVar33 <= dVar35) {
          dVar33 = dVar35;
        }
      }
      dVar35 = 0.0;
      if (ABS(dVar33) != INFINITY) {
        dVar35 = dVar33;
      }
      dVar32 = dVar32 + (double)puVar3[uVar28] * dVar35;
      piVar16->pi = dVar32;
    }
    piVar16->pi = piVar16->imin -
                  dVar32 / (((double)CONCAT44(0x45300000,(int)(piVar12->counts >> 0x20)) -
                            1.9342813113834067e+25) +
                           ((double)CONCAT44(0x43300000,(int)piVar12->counts) - 4503599627370496.0))
    ;
  }
  cleanup(ctx);
  return piVar17;
}

Assistant:

inform_pid_lattice *inform_pid(int const *stimulus, int const *responses,
        size_t l, size_t n, int bs, int const *br, inform_error *err)
{
    if (check_arguments(stimulus, responses, l, n, bs, br, err))
    {
        return NULL;
    }
    size_t **ss = subsets(l, err);
    if (FAILED(err))
    {
        return NULL;
    }

    size_t const m = gvector_len(ss);

    inform_dist *s_dist = inform_dist_infer(stimulus, n);
    if (s_dist == NULL)
    {
        cleanup(ss, NULL, NULL);
        INFORM_ERROR_RETURN(err, INFORM_ENOMEM, NULL);
    }

    double **si = gvector_alloc(m, m, sizeof(double*));
    if (si == NULL)
    {
        cleanup(ss, s_dist, si);
        INFORM_ERROR_RETURN(err, INFORM_ENOMEM, NULL);
    }
    for (size_t i = 0; i < m; ++i) si[i] = NULL;
    for (size_t i = 0; i < m; ++i)
    {
        si[i] = specific_info(stimulus, responses, l, n, bs, br, ss[i], s_dist, err);
        if (FAILED(err))
        {
            cleanup(ss, s_dist, si);
            return NULL;
        }
    }

    inform_pid_lattice *lattice = hasse(l, err);
    if (FAILED(err))
    {
        cleanup(ss, s_dist, si);
        return NULL;
    }

    for (size_t i = 0; i < lattice->size; ++i)
    {
        inform_pid_source *alpha = lattice->sources[i];
        alpha->imin = 0.0;
        for (size_t s = 0; s < (size_t)bs; ++s)
        {
            double x = si[alpha->name[0]-1][s];
            for (size_t k = 1; k < alpha->size; ++k)
            {
                x = MIN(x, si[alpha->name[k]-1][s]);
            }
            alpha->imin += s_dist->histogram[s] * x;
        }
        alpha->imin /= s_dist->counts;
    }

    for (size_t i = 0; i < lattice->size; ++i)
    {
        inform_pid_source *alpha = lattice->sources[i];
        for (size_t s = 0; s < (size_t)bs; ++s)
        {
            double u = -INFINITY;
            for (size_t j = 0; j < alpha->n_below; ++j)
            {
                inform_pid_source *beta = alpha->below[j];
                double x = si[beta->name[0]-1][s];
                for (size_t k = 1; k < beta->size; ++k)
                {
                    x = MIN(x, si[beta->name[k]-1][s]);
                }
                u = MAX(u, x);
            }
            if (isinf(u))
            {
                u = 0.0;
            }
            alpha->pi += s_dist->histogram[s] * u;
        }
        alpha->pi = alpha->imin - alpha->pi / s_dist->counts;
    }

    cleanup(ss, s_dist, si);

    return lattice;
}